

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O1

void IDAAdjFree(void *ida_mem)

{
  void *__ptr;
  long lVar1;
  void *__ptr_00;
  void *in_RAX;
  long lVar2;
  void *local_28;
  
  if ((ida_mem != (void *)0x0) && (*(int *)((long)ida_mem + 0x848) != 0)) {
    __ptr = *(void **)((long)ida_mem + 0x840);
    local_28 = in_RAX;
    if (*(long *)((long)__ptr + 0x50) != 0) {
      do {
        IDAAckpntDelete((IDAckpntMem *)((long)__ptr + 0x50));
      } while (*(IDAckpntMem *)((long)__ptr + 0x50) != (IDAckpntMem)0x0);
    }
    lVar1 = *(long *)((long)ida_mem + 0x840);
    if (lVar1 != 0) {
      (**(code **)(lVar1 + 0xa8))(ida_mem);
      if (-1 < *(long *)(lVar1 + 0x68)) {
        lVar2 = -1;
        do {
          free(*(void **)(*(long *)(lVar1 + 0x78) + 8 + lVar2 * 8));
          *(undefined8 *)(*(long *)(lVar1 + 0x78) + 8 + lVar2 * 8) = 0;
          lVar2 = lVar2 + 1;
        } while (lVar2 < *(long *)(lVar1 + 0x68));
      }
      free(*(void **)(lVar1 + 0x78));
      *(undefined8 *)(lVar1 + 0x78) = 0;
    }
    __ptr_00 = *(void **)((long)__ptr + 0x30);
    while (__ptr_00 != (void *)0x0) {
      *(undefined8 *)((long)__ptr + 0x30) = *(undefined8 *)((long)__ptr_00 + 0x80);
      local_28 = *(void **)((long)__ptr_00 + 0x10);
      IDAFree(&local_28);
      if (*(code **)((long)__ptr_00 + 0x50) != (code *)0x0) {
        (**(code **)((long)__ptr_00 + 0x50))(__ptr_00);
      }
      if (*(code **)((long)__ptr_00 + 0x60) != (code *)0x0) {
        (**(code **)((long)__ptr_00 + 0x60))(__ptr_00);
      }
      N_VDestroy(*(undefined8 *)((long)__ptr_00 + 0x70));
      N_VDestroy(*(undefined8 *)((long)__ptr_00 + 0x78));
      free(__ptr_00);
      __ptr_00 = *(void **)((long)__ptr + 0x30);
    }
    free(__ptr);
    *(undefined8 *)((long)ida_mem + 0x840) = 0;
  }
  return;
}

Assistant:

void IDAAdjFree(void* ida_mem)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;

  if (ida_mem == NULL) { return; }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_adjMallocDone)
  {
    /* Data for adjoint. */
    IDAADJ_mem = IDA_mem->ida_adj_mem;

    /* Delete check points one by one */
    while (IDAADJ_mem->ck_mem != NULL)
    {
      IDAAckpntDelete(&(IDAADJ_mem->ck_mem));
    }

    IDAAdataFree(IDA_mem);

    /* Free all backward problems. */
    while (IDAADJ_mem->IDAB_mem != NULL)
    {
      IDAAbckpbDelete(&(IDAADJ_mem->IDAB_mem));
    }

    /* Free IDAA memory. */
    free(IDAADJ_mem);

    IDA_mem->ida_adj_mem = NULL;
  }
}